

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

void __thiscall leveldb::Version::Unref(Version *this)

{
  int iVar1;
  
  if (&this->vset_->dummy_versions_ == this) {
    __assert_fail("this != &vset_->dummy_versions_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                  ,0x1dd,"void leveldb::Version::Unref()");
  }
  if (0 < this->refs_) {
    iVar1 = this->refs_ + -1;
    this->refs_ = iVar1;
    if (iVar1 != 0) {
      return;
    }
    ~Version(this);
    operator_delete(this);
    return;
  }
  __assert_fail("refs_ >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/version_set.cc"
                ,0x1de,"void leveldb::Version::Unref()");
}

Assistant:

void Version::Unref() {
  assert(this != &vset_->dummy_versions_);
  assert(refs_ >= 1);
  --refs_;
  if (refs_ == 0) {
    delete this;
  }
}